

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugServerConsole.cxx
# Opt level: O1

void __thiscall cmDebugServerConsole::OnChangeState(cmDebugServerConsole *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  undefined8 *puVar6;
  ulong *puVar7;
  ulong uVar8;
  long *plVar9;
  size_type *psVar10;
  ulong uVar11;
  uint __len;
  cmListFileContext currentLine;
  string __str;
  cmPauseContext ctx;
  cmListFileContext local_170;
  long *local_128;
  undefined8 local_120;
  long local_118;
  undefined8 uStack_110;
  ulong *local_108;
  long local_100;
  ulong local_f8 [2];
  ulong *local_e8;
  long local_e0;
  ulong local_d8;
  long lStack_d0;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  cmPauseContext local_48;
  
  iVar4 = (*((this->super_cmDebugServer).super_cmDebuggerListener.Debugger)->_vptr_cmDebugger[9])();
  if (iVar4 == 0) {
    paVar1 = &local_170.Name.field_2;
    local_170.Name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"Unknown state\n","");
    cmDebugServer::AsyncBroadcast(&this->super_cmDebugServer,&local_170.Name);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170.Name._M_dataplus._M_p != paVar1) {
      operator_delete(local_170.Name._M_dataplus._M_p,
                      local_170.Name.field_2._M_allocated_capacity + 1);
    }
    if (this->PrintPrompt != true) {
      return;
    }
    cmDebugServer::AsyncBroadcast(&this->super_cmDebugServer,&PROMPT_abi_cxx11_);
    return;
  }
  if (iVar4 != 2) {
    if (iVar4 != 1) {
      return;
    }
    paVar1 = &local_170.Name.field_2;
    local_170.Name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"Running...\n","");
    cmDebugServer::AsyncBroadcast(&this->super_cmDebugServer,&local_170.Name);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170.Name._M_dataplus._M_p == paVar1) {
      return;
    }
    operator_delete(local_170.Name._M_dataplus._M_p,local_170.Name.field_2._M_allocated_capacity + 1
                   );
    return;
  }
  (*((this->super_cmDebugServer).super_cmDebuggerListener.Debugger)->_vptr_cmDebugger[0x17])
            (&local_48);
  bVar3 = cmPauseContext::operator_cast_to_bool(&local_48);
  if (bVar3) {
    cmPauseContext::CurrentLine(&local_170,&local_48);
    std::operator+(&local_68,"Paused at ",&local_170.FilePath);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_68);
    puVar7 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar7) {
      local_d8 = *puVar7;
      lStack_d0 = plVar5[3];
      local_e8 = &local_d8;
    }
    else {
      local_d8 = *puVar7;
      local_e8 = (ulong *)*plVar5;
    }
    local_e0 = plVar5[1];
    *plVar5 = (long)puVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    uVar11 = -local_170.Line;
    if (0 < local_170.Line) {
      uVar11 = local_170.Line;
    }
    __len = 1;
    if (9 < uVar11) {
      uVar8 = uVar11;
      uVar2 = 4;
      do {
        __len = uVar2;
        if (uVar8 < 100) {
          __len = __len - 2;
          goto LAB_00462d1c;
        }
        if (uVar8 < 1000) {
          __len = __len - 1;
          goto LAB_00462d1c;
        }
        if (uVar8 < 10000) goto LAB_00462d1c;
        bVar3 = 99999 < uVar8;
        uVar8 = uVar8 / 10000;
        uVar2 = __len + 4;
      } while (bVar3);
      __len = __len + 1;
    }
LAB_00462d1c:
    local_108 = local_f8;
    std::__cxx11::string::_M_construct
              ((ulong)&local_108,(char)__len - (char)(local_170.Line >> 0x3f));
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)((long)local_108 - (local_170.Line >> 0x3f)),__len,uVar11);
    uVar11 = 0xf;
    if (local_e8 != &local_d8) {
      uVar11 = local_d8;
    }
    if (uVar11 < (ulong)(local_100 + local_e0)) {
      uVar11 = 0xf;
      if (local_108 != local_f8) {
        uVar11 = local_f8[0];
      }
      if (uVar11 < (ulong)(local_100 + local_e0)) goto LAB_00462d9b;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_108,0,(char *)0x0,(ulong)local_e8);
    }
    else {
LAB_00462d9b:
      puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_108);
    }
    local_128 = &local_118;
    plVar5 = puVar6 + 2;
    if ((long *)*puVar6 == plVar5) {
      local_118 = *plVar5;
      uStack_110 = puVar6[3];
    }
    else {
      local_118 = *plVar5;
      local_128 = (long *)*puVar6;
    }
    local_120 = puVar6[1];
    *puVar6 = plVar5;
    puVar6[1] = 0;
    *(undefined1 *)plVar5 = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_128);
    plVar9 = plVar5 + 2;
    if ((long *)*plVar5 == plVar9) {
      local_b8 = *plVar9;
      lStack_b0 = plVar5[3];
      local_c8 = &local_b8;
    }
    else {
      local_b8 = *plVar9;
      local_c8 = (long *)*plVar5;
    }
    local_c0 = plVar5[1];
    *plVar5 = (long)plVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_c8,(ulong)local_170.Name._M_dataplus._M_p);
    plVar9 = plVar5 + 2;
    if ((long *)*plVar5 == plVar9) {
      local_98 = *plVar9;
      lStack_90 = plVar5[3];
      local_a8 = &local_98;
    }
    else {
      local_98 = *plVar9;
      local_a8 = (long *)*plVar5;
    }
    local_a0 = plVar5[1];
    *plVar5 = (long)plVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_a8);
    psVar10 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_88.field_2._M_allocated_capacity = *psVar10;
      local_88.field_2._8_8_ = plVar5[3];
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    }
    else {
      local_88.field_2._M_allocated_capacity = *psVar10;
      local_88._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_88._M_string_length = plVar5[1];
    *plVar5 = (long)psVar10;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    cmDebugServer::AsyncBroadcast(&this->super_cmDebugServer,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if (local_a8 != &local_98) {
      operator_delete(local_a8,local_98 + 1);
    }
    if (local_c8 != &local_b8) {
      operator_delete(local_c8,local_b8 + 1);
    }
    if (local_128 != &local_118) {
      operator_delete(local_128,local_118 + 1);
    }
    if (local_108 != local_f8) {
      operator_delete(local_108,local_f8[0] + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170.FilePath._M_dataplus._M_p != &local_170.FilePath.field_2) {
      operator_delete(local_170.FilePath._M_dataplus._M_p,
                      local_170.FilePath.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170.Name._M_dataplus._M_p == &local_170.Name.field_2) goto LAB_00462c5c;
  }
  else {
    paVar1 = &local_170.Name.field_2;
    local_170.Name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_170,"Paused at indeterminate state\n","");
    cmDebugServer::AsyncBroadcast(&this->super_cmDebugServer,&local_170.Name);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170.Name._M_dataplus._M_p == paVar1) goto LAB_00462c5c;
  }
  operator_delete(local_170.Name._M_dataplus._M_p,local_170.Name.field_2._M_allocated_capacity + 1);
LAB_00462c5c:
  cmDebugServer::AsyncBroadcast(&this->super_cmDebugServer,&PROMPT_abi_cxx11_);
  std::unique_lock<std::recursive_timed_mutex>::~unique_lock(&local_48.Lock);
  return;
}

Assistant:

void cmDebugServerConsole::OnChangeState()
{
  cmDebugServer::OnChangeState();

  switch (Debugger.CurrentState()) {
    case cmDebugger::State::Running:
      AsyncBroadcast("Running...\n");
      break;
    case cmDebugger::State::Paused: {
      auto ctx = Debugger.PauseContext();
      if (ctx) {
        auto currentLine = ctx.CurrentLine();
        AsyncBroadcast("Paused at " + currentLine.FilePath + ":" +
                       std::to_string(currentLine.Line) + " (" +
                       currentLine.Name + ")\n");
      } else {
        AsyncBroadcast("Paused at indeterminate state\n");
      }
      AsyncBroadcast(PROMPT);
    } break;
    case cmDebugger::State::Unknown:
      AsyncBroadcast("Unknown state\n");
      printPrompt();
      break;
  }
}